

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

bool __thiscall GraphLibrary::Graph::has_edge(Graph *this,Node v,Node w)

{
  pointer pvVar1;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var2;
  undefined1 local_14 [4];
  
  pvVar1 = (this->m_adjacency_lists).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                    (*(undefined8 *)
                      &pvVar1[v].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl,
                     *(pointer *)
                      ((long)&pvVar1[v].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl + 8),local_14);
  return _Var2._M_current !=
         *(pointer *)
          ((long)&(this->m_adjacency_lists).
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[v].
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8);
}

Assistant:

bool Graph::has_edge(const Node v, const Node w) const {
        if (find(m_adjacency_lists[v].begin(), m_adjacency_lists[v].end(), w) != m_adjacency_lists[v].end()) {
            return true;
        } else {
            return false;
        }
    }